

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O1

void __thiscall absl::time_internal::cctz::time_zone::Impl::Impl(Impl *this,string *name)

{
  pointer pcVar1;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  TimeZoneIf::Load((TimeZoneIf *)&this->zone_,&this->name_);
  return;
}

Assistant:

time_zone::Impl::Impl(const std::string& name)
    : name_(name), zone_(TimeZoneIf::Load(name_)) {}